

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd256.c
# Opt level: O1

int rmd256_done(hash_state *md,uchar *out)

{
  int iVar1;
  ulong uVar2;
  ulong32 uVar3;
  long lVar4;
  
  if (md == (hash_state *)0x0) {
    rmd256_done_cold_1();
  }
  if (out == (uchar *)0x0) {
    rmd256_done_cold_2();
  }
  uVar2 = (ulong)(md->rmd128).curlen;
  iVar1 = 0x10;
  if (uVar2 < 0x40) {
    md->data = (void *)((long)md->data + uVar2 * 8);
    (md->rmd128).curlen = (md->rmd128).curlen + 1;
    md->dummy[uVar2 + 8] = -0x80;
    if (0x38 < (md->rmd128).curlen) {
      uVar2 = (ulong)(md->rmd128).curlen;
      if ((ulong)(md->rmd128).curlen < 0x40) {
        do {
          uVar3 = (ulong32)(uVar2 + 1);
          (md->rmd128).curlen = uVar3;
          md->dummy[uVar2 + 8] = '\0';
          uVar2 = uVar2 + 1;
        } while (uVar3 != 0x40);
      }
      rmd256_compress(md,(md->chc).state);
      (md->rmd128).curlen = 0;
    }
    uVar2 = (ulong)(md->rmd128).curlen;
    if ((ulong)(md->rmd128).curlen < 0x38) {
      do {
        uVar3 = (ulong32)(uVar2 + 1);
        (md->rmd128).curlen = uVar3;
        md->dummy[uVar2 + 8] = '\0';
        uVar2 = uVar2 + 1;
      } while (uVar3 != 0x38);
    }
    (md->whirlpool).state[7] = (md->chc).length;
    rmd256_compress(md,(md->chc).state);
    iVar1 = 0;
    lVar4 = 0;
    do {
      *(undefined4 *)(out + lVar4 * 4) = *(undefined4 *)((long)md + lVar4 * 4 + 0x4c);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
  }
  return iVar1;
}

Assistant:

int rmd256_done(hash_state * md, unsigned char *out)
{
    int i;

    LTC_ARGCHK(md  != NULL);
    LTC_ARGCHK(out != NULL);

    if (md->rmd256.curlen >= sizeof(md->rmd256.buf)) {
       return CRYPT_INVALID_ARG;
    }


    /* increase the length of the message */
    md->rmd256.length += md->rmd256.curlen * 8;

    /* append the '1' bit */
    md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0x80;

    /* if the length is currently above 56 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->rmd256.curlen > 56) {
        while (md->rmd256.curlen < 64) {
            md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0;
        }
        rmd256_compress(md, md->rmd256.buf);
        md->rmd256.curlen = 0;
    }

    /* pad upto 56 bytes of zeroes */
    while (md->rmd256.curlen < 56) {
        md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64L(md->rmd256.length, md->rmd256.buf+56);
    rmd256_compress(md, md->rmd256.buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE32L(md->rmd256.state[i], out+(4*i));
    }
#ifdef LTC_CLEAN_STACK
    zeromem(md, sizeof(hash_state));
#endif
   return CRYPT_OK;
}